

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O2

void __thiscall MeCab::Dictionary::Dictionary(Dictionary *this)

{
  Mmap<char> *this_00;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_00139c18;
  this_00 = (Mmap<char> *)operator_new(0x1d8);
  Mmap<char>::Mmap(this_00);
  (this->dmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139070;
  (this->dmmap_).ptr_ = this_00;
  this->token_ = (Token *)0x0;
  this->feature_ = (char *)0x0;
  this->charset_ = (char *)0x0;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  whatlog::whatlog(&this->what_);
  (this->da_).no_delete_ = false;
  (this->da_).error_ = 0;
  (this->da_).array_ = (unit_t *)0x0;
  (this->da_).used_ = (uchar *)0x0;
  (this->da_).size_ = 0;
  (this->da_).alloc_size_ = 0;
  return;
}

Assistant:

explicit Dictionary(): dmmap_(new Mmap<char>), token_(0),
                         feature_(0), charset_(0) {}